

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StmListGenerator.cpp
# Opt level: O1

void __thiscall StmListGenerator::generate(StmListGenerator *this,ostream *output,ScName *stmName)

{
  pointer pSVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::at(&((this->super_AbstractGenerator).m_model)->m_states,&ScModel::RootScName_abi_cxx11_
               );
  if (stmName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"Note: discarding a state-machine name\n",0x26);
  }
  if ((pmVar2->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pmVar2->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"No state-machines found\n",0x18);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(output,"Available state-machines:\n",0x1a);
    pSVar1 = (pmVar2->regions).super__Vector_base<ScRegion,_std::allocator<ScRegion>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var4 = *(_Base_ptr *)((long)&(pSVar1->states)._M_t._M_impl + 0x18);
        p_Var4 != (_Rb_tree_node_base *)((long)&(pSVar1->states)._M_t._M_impl + 8U);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::__ostream_insert<char,std::char_traits<char>>(output,"    ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    }
  }
  std::ostream::flush();
  return;
}

Assistant:

void StmListGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &rootState = m_model.states().at(ScModel::RootScName);

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    if (rootState.regions.empty()) {
        output << "No state-machines found\n";
    } else {
        output << "Available state-machines:\n";
        for (const auto &stm : rootState.regions[0].states) {
            output << "    " << stm << "\n";
        }
    }

    output.flush();
}